

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersector1<4,_16777232,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  int iVar25;
  int iVar26;
  Geometry *pGVar27;
  long lVar28;
  long lVar29;
  RTCIntersectArguments *pRVar30;
  RTCRayQueryContext *pRVar31;
  long lVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 uVar39;
  undefined8 uVar40;
  undefined1 (*pauVar41) [16];
  int iVar42;
  AABBNodeMB4D *node1;
  ulong uVar43;
  ulong uVar44;
  RayHit *pRVar45;
  ulong uVar46;
  float *vertices;
  long lVar47;
  int *piVar48;
  ulong uVar49;
  undefined4 uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar85;
  float fVar86;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar89;
  float fVar96;
  float fVar97;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  float fVar107;
  float fVar108;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar109;
  undefined1 auVar106 [16];
  float fVar110;
  float fVar114;
  float fVar115;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  int local_11cc;
  undefined1 local_11c8 [16];
  Scene *local_11b8;
  RTCFilterFunctionNArguments local_11b0;
  ulong local_1180;
  ulong local_1178;
  ulong local_1170;
  ulong local_1168;
  ulong local_1160;
  undefined1 (*local_1158) [16];
  long local_1150;
  long local_1148;
  ulong local_1140;
  float local_1138;
  undefined4 local_1134;
  float local_1130;
  float local_112c;
  float local_1128;
  undefined4 local_1124;
  uint local_1120;
  uint local_111c;
  uint local_1118;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined1 local_10f8 [16];
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  uint local_10a8;
  uint uStack_10a4;
  uint uStack_10a0;
  uint uStack_109c;
  float local_1098 [4];
  float local_1088 [4];
  float local_1078 [4];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  float local_1048 [4];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  uint local_fc8;
  uint uStack_fc4;
  uint uStack_fc0;
  uint uStack_fbc;
  undefined8 local_fb8;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_1158 = (undefined1 (*) [16])local_f68;
      local_1008 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1018 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_fd8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar73 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_fe8 = 0.0;
      if (0.0 <= fVar73) {
        local_fe8 = fVar73;
      }
      fVar63 = (ray->super_RayK<1>).dir.field_0.m128[0];
      fVar128 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar143 = (ray->super_RayK<1>).dir.field_0.m128[2];
      fVar146 = (ray->super_RayK<1>).dir.field_0.m128[3];
      fVar73 = (ray->super_RayK<1>).tfar;
      fVar64 = 0.0;
      if (0.0 <= fVar73) {
        fVar64 = fVar73;
      }
      uVar59 = -(uint)((float)DAT_01ff1d40 <= ABS(fVar63));
      uVar60 = -(uint)(DAT_01ff1d40._4_4_ <= ABS(fVar128));
      uVar61 = -(uint)(DAT_01ff1d40._8_4_ <= ABS(fVar143));
      uVar62 = -(uint)(DAT_01ff1d40._12_4_ <= ABS(fVar146));
      auVar80._0_4_ = (uint)fVar63 & uVar59;
      auVar80._4_4_ = (uint)fVar128 & uVar60;
      auVar80._8_4_ = (uint)fVar143 & uVar61;
      auVar80._12_4_ = (uint)fVar146 & uVar62;
      auVar90._0_4_ = ~uVar59 & (uint)(float)DAT_01ff1d40;
      auVar90._4_4_ = ~uVar60 & (uint)DAT_01ff1d40._4_4_;
      auVar90._8_4_ = ~uVar61 & (uint)DAT_01ff1d40._8_4_;
      auVar90._12_4_ = ~uVar62 & (uint)DAT_01ff1d40._12_4_;
      auVar90 = auVar90 | auVar80;
      auVar79 = rcpps(auVar80,auVar90);
      local_1028 = auVar79._0_4_;
      local_1038 = auVar79._4_4_;
      local_ff8 = auVar79._8_4_;
      local_1028 = (1.0 - auVar90._0_4_ * local_1028) * local_1028 + local_1028;
      local_1038 = (1.0 - auVar90._4_4_ * local_1038) * local_1038 + local_1038;
      local_ff8 = (1.0 - auVar90._8_4_ * local_ff8) * local_ff8 + local_ff8;
      local_1160 = (ulong)(local_1028 < 0.0) << 4;
      local_1168 = (ulong)(local_1038 < 0.0) << 4 | 0x20;
      uVar56 = (ulong)(local_ff8 < 0.0) << 4 | 0x40;
      auVar79._4_4_ = fVar64;
      auVar79._0_4_ = fVar64;
      auVar79._8_4_ = fVar64;
      auVar79._12_4_ = fVar64;
      _local_fc8 = mm_lookupmask_ps._240_8_;
      _uStack_fc0 = mm_lookupmask_ps._248_8_;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      local_1170 = uVar56;
      local_1178 = local_1160 ^ 0x10;
      local_1180 = local_1168 ^ 0x10;
      uVar44 = local_1168;
      uVar46 = local_1168 ^ 0x10;
      uVar49 = local_1160;
      uVar51 = local_1160 ^ 0x10;
      uVar53 = uVar56;
      fVar73 = local_fd8;
      fVar64 = local_fd8;
      fVar63 = local_fd8;
      fVar128 = local_fd8;
      fVar143 = local_fe8;
      fVar146 = local_fe8;
      fVar65 = local_fe8;
      fVar70 = local_fe8;
      fVar71 = local_ff8;
      fVar72 = local_ff8;
      fVar78 = local_ff8;
      fVar85 = local_ff8;
      fVar86 = local_1008;
      fVar87 = local_1008;
      fVar88 = local_1008;
      fVar89 = local_1008;
      fVar96 = local_1018;
      fVar97 = local_1018;
      fVar98 = local_1018;
      fVar99 = local_1018;
      fVar107 = local_1028;
      fVar108 = local_1028;
      fVar109 = local_1028;
      fVar110 = local_1028;
      fVar114 = local_1038;
      fVar115 = local_1038;
      fVar116 = local_1038;
      fVar120 = local_1038;
      do {
        do {
          do {
            if (local_1158 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar41 = local_1158 + -1;
            local_1158 = local_1158 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar41 + 8));
          uVar58 = *(ulong *)*local_1158;
          do {
            if ((uVar58 & 8) == 0) {
              fVar122 = (ray->super_RayK<1>).dir.field_0.m128[3];
              uVar43 = uVar58 & 0xfffffffffffffff0;
              pfVar22 = (float *)(uVar43 + 0x80 + uVar49);
              pfVar21 = (float *)(uVar43 + 0x20 + uVar49);
              auVar113._0_4_ = ((*pfVar22 * fVar122 + *pfVar21) - fVar86) * fVar107;
              auVar113._4_4_ = ((pfVar22[1] * fVar122 + pfVar21[1]) - fVar87) * fVar108;
              auVar113._8_4_ = ((pfVar22[2] * fVar122 + pfVar21[2]) - fVar88) * fVar109;
              auVar113._12_4_ = ((pfVar22[3] * fVar122 + pfVar21[3]) - fVar89) * fVar110;
              auVar105._4_4_ = fVar146;
              auVar105._0_4_ = fVar143;
              auVar105._8_4_ = fVar65;
              auVar105._12_4_ = fVar70;
              pfVar22 = (float *)(uVar43 + 0x80 + uVar44);
              pfVar21 = (float *)(uVar43 + 0x20 + uVar44);
              auVar80 = maxps(auVar105,auVar113);
              auVar100._0_4_ = ((*pfVar22 * fVar122 + *pfVar21) - fVar96) * fVar114;
              auVar100._4_4_ = ((pfVar22[1] * fVar122 + pfVar21[1]) - fVar97) * fVar115;
              auVar100._8_4_ = ((pfVar22[2] * fVar122 + pfVar21[2]) - fVar98) * fVar116;
              auVar100._12_4_ = ((pfVar22[3] * fVar122 + pfVar21[3]) - fVar99) * fVar120;
              pfVar22 = (float *)(uVar43 + 0x80 + uVar53);
              pfVar21 = (float *)(uVar43 + 0x20 + uVar53);
              auVar118._0_4_ = ((*pfVar22 * fVar122 + *pfVar21) - fVar73) * fVar71;
              auVar118._4_4_ = ((pfVar22[1] * fVar122 + pfVar21[1]) - fVar64) * fVar72;
              auVar118._8_4_ = ((pfVar22[2] * fVar122 + pfVar21[2]) - fVar63) * fVar78;
              auVar118._12_4_ = ((pfVar22[3] * fVar122 + pfVar21[3]) - fVar128) * fVar85;
              auVar90 = maxps(auVar100,auVar118);
              local_10f8 = maxps(auVar80,auVar90);
              pfVar23 = (float *)(uVar43 + 0x80 + uVar51);
              pfVar21 = (float *)(uVar43 + 0x20 + uVar51);
              pfVar24 = (float *)(uVar43 + 0x80 + uVar46);
              pfVar22 = (float *)(uVar43 + 0x20 + uVar46);
              auVar101._0_4_ = ((*pfVar23 * fVar122 + *pfVar21) - fVar86) * fVar107;
              auVar101._4_4_ = ((pfVar23[1] * fVar122 + pfVar21[1]) - fVar87) * fVar108;
              auVar101._8_4_ = ((pfVar23[2] * fVar122 + pfVar21[2]) - fVar88) * fVar109;
              auVar101._12_4_ = ((pfVar23[3] * fVar122 + pfVar21[3]) - fVar89) * fVar110;
              auVar111._0_4_ = ((*pfVar24 * fVar122 + *pfVar22) - fVar96) * fVar114;
              auVar111._4_4_ = ((pfVar24[1] * fVar122 + pfVar22[1]) - fVar97) * fVar115;
              auVar111._8_4_ = ((pfVar24[2] * fVar122 + pfVar22[2]) - fVar98) * fVar116;
              auVar111._12_4_ = ((pfVar24[3] * fVar122 + pfVar22[3]) - fVar99) * fVar120;
              pfVar22 = (float *)(uVar43 + 0x80 + (uVar56 ^ 0x10));
              pfVar21 = (float *)(uVar43 + 0x20 + (uVar56 ^ 0x10));
              auVar91._0_4_ = ((*pfVar22 * fVar122 + *pfVar21) - fVar73) * fVar71;
              auVar91._4_4_ = ((pfVar22[1] * fVar122 + pfVar21[1]) - fVar64) * fVar72;
              auVar91._8_4_ = ((pfVar22[2] * fVar122 + pfVar21[2]) - fVar63) * fVar78;
              auVar91._12_4_ = ((pfVar22[3] * fVar122 + pfVar21[3]) - fVar128) * fVar85;
              auVar90 = minps(auVar111,auVar91);
              auVar80 = minps(auVar79,auVar101);
              auVar80 = minps(auVar80,auVar90);
              if (((uint)uVar58 & 7) == 6) {
                bVar33 = (fVar122 < *(float *)(uVar43 + 0xf0) &&
                         *(float *)(uVar43 + 0xe0) <= fVar122) && local_10f8._0_4_ <= auVar80._0_4_;
                bVar34 = (fVar122 < *(float *)(uVar43 + 0xf4) &&
                         *(float *)(uVar43 + 0xe4) <= fVar122) && local_10f8._4_4_ <= auVar80._4_4_;
                bVar35 = (fVar122 < *(float *)(uVar43 + 0xf8) &&
                         *(float *)(uVar43 + 0xe8) <= fVar122) && local_10f8._8_4_ <= auVar80._8_4_;
                bVar36 = (fVar122 < *(float *)(uVar43 + 0xfc) &&
                         *(float *)(uVar43 + 0xec) <= fVar122) &&
                         local_10f8._12_4_ <= auVar80._12_4_;
              }
              else {
                bVar33 = local_10f8._0_4_ <= auVar80._0_4_;
                bVar34 = local_10f8._4_4_ <= auVar80._4_4_;
                bVar35 = local_10f8._8_4_ <= auVar80._8_4_;
                bVar36 = local_10f8._12_4_ <= auVar80._12_4_;
              }
              auVar74._0_4_ = (uint)bVar33 * -0x80000000;
              auVar74._4_4_ = (uint)bVar34 * -0x80000000;
              auVar74._8_4_ = (uint)bVar35 * -0x80000000;
              auVar74._12_4_ = (uint)bVar36 * -0x80000000;
              uVar50 = movmskps((int)This,auVar74);
              This = (Intersectors *)CONCAT44((int)((ulong)This >> 0x20),uVar50);
            }
            if ((uVar58 & 8) == 0) {
              if (This == (Intersectors *)0x0) {
                iVar42 = 4;
              }
              else {
                uVar43 = uVar58 & 0xfffffffffffffff0;
                lVar32 = 0;
                if (This != (Intersectors *)0x0) {
                  for (; ((ulong)This >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                  }
                }
                iVar42 = 0;
                uVar58 = *(ulong *)(uVar43 + lVar32 * 8);
                uVar52 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
                if (uVar52 != 0) {
                  uVar59 = *(uint *)(local_10f8 + lVar32 * 4);
                  lVar32 = 0;
                  if (uVar52 != 0) {
                    for (; (uVar52 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                    }
                  }
                  uVar54 = *(ulong *)(uVar43 + lVar32 * 8);
                  uVar60 = *(uint *)(local_10f8 + lVar32 * 4);
                  uVar52 = uVar52 - 1 & uVar52;
                  if (uVar52 == 0) {
                    if (uVar59 < uVar60) {
                      *(ulong *)*local_1158 = uVar54;
                      *(uint *)((long)*local_1158 + 8) = uVar60;
                      local_1158 = local_1158 + 1;
                    }
                    else {
                      *(ulong *)*local_1158 = uVar58;
                      *(uint *)((long)*local_1158 + 8) = uVar59;
                      local_1158 = local_1158 + 1;
                      uVar58 = uVar54;
                    }
                  }
                  else {
                    auVar75._8_4_ = uVar59;
                    auVar75._0_8_ = uVar58;
                    auVar75._12_4_ = 0;
                    auVar81._8_4_ = uVar60;
                    auVar81._0_8_ = uVar54;
                    auVar81._12_4_ = 0;
                    lVar32 = 0;
                    if (uVar52 != 0) {
                      for (; (uVar52 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                      }
                    }
                    uVar58 = *(ulong *)(uVar43 + lVar32 * 8);
                    iVar25 = *(int *)(local_10f8 + lVar32 * 4);
                    auVar92._8_4_ = iVar25;
                    auVar92._0_8_ = uVar58;
                    auVar92._12_4_ = 0;
                    auVar102._8_4_ = -(uint)((int)uVar59 < (int)uVar60);
                    uVar52 = uVar52 - 1 & uVar52;
                    if (uVar52 == 0) {
                      auVar102._4_4_ = auVar102._8_4_;
                      auVar102._0_4_ = auVar102._8_4_;
                      auVar102._12_4_ = auVar102._8_4_;
                      auVar80 = auVar75 & auVar102 | ~auVar102 & auVar81;
                      auVar90 = auVar81 & auVar102 | ~auVar102 & auVar75;
                      auVar103._8_4_ = -(uint)(auVar80._8_4_ < iVar25);
                      auVar103._0_8_ = CONCAT44(auVar103._8_4_,auVar103._8_4_);
                      auVar103._12_4_ = auVar103._8_4_;
                      uVar58 = ~auVar103._0_8_ & uVar58 | auVar80._0_8_ & auVar103._0_8_;
                      auVar80 = auVar92 & auVar103 | ~auVar103 & auVar80;
                      auVar76._8_4_ = -(uint)(auVar90._8_4_ < auVar80._8_4_);
                      auVar76._4_4_ = auVar76._8_4_;
                      auVar76._0_4_ = auVar76._8_4_;
                      auVar76._12_4_ = auVar76._8_4_;
                      *local_1158 = ~auVar76 & auVar90 | auVar80 & auVar76;
                      local_1158[1] = auVar90 & auVar76 | ~auVar76 & auVar80;
                      local_1158 = local_1158 + 2;
                    }
                    else {
                      lVar32 = 0;
                      if (uVar52 != 0) {
                        for (; (uVar52 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                        }
                      }
                      iVar26 = *(int *)(local_10f8 + lVar32 * 4);
                      auVar112._8_4_ = iVar26;
                      auVar112._0_8_ = *(undefined8 *)(uVar43 + lVar32 * 8);
                      auVar112._12_4_ = 0;
                      auVar104._4_4_ = auVar102._8_4_;
                      auVar104._0_4_ = auVar102._8_4_;
                      auVar104._8_4_ = auVar102._8_4_;
                      auVar104._12_4_ = auVar102._8_4_;
                      auVar80 = auVar75 & auVar104 | ~auVar104 & auVar81;
                      auVar90 = auVar81 & auVar104 | ~auVar104 & auVar75;
                      auVar117._0_4_ = -(uint)(iVar25 < iVar26);
                      auVar117._4_4_ = -(uint)(iVar25 < iVar26);
                      auVar117._8_4_ = -(uint)(iVar25 < iVar26);
                      auVar117._12_4_ = -(uint)(iVar25 < iVar26);
                      auVar105 = auVar92 & auVar117 | ~auVar117 & auVar112;
                      auVar118 = ~auVar117 & auVar92 | auVar112 & auVar117;
                      auVar93._8_4_ = -(uint)(auVar90._8_4_ < auVar118._8_4_);
                      auVar93._4_4_ = auVar93._8_4_;
                      auVar93._0_4_ = auVar93._8_4_;
                      auVar93._12_4_ = auVar93._8_4_;
                      auVar113 = auVar90 & auVar93 | ~auVar93 & auVar118;
                      auVar82._8_4_ = -(uint)(auVar80._8_4_ < auVar105._8_4_);
                      auVar82._0_8_ = CONCAT44(auVar82._8_4_,auVar82._8_4_);
                      auVar82._12_4_ = auVar82._8_4_;
                      uVar58 = auVar80._0_8_ & auVar82._0_8_ | ~auVar82._0_8_ & auVar105._0_8_;
                      auVar80 = ~auVar82 & auVar80 | auVar105 & auVar82;
                      auVar77._8_4_ = -(uint)(auVar80._8_4_ < auVar113._8_4_);
                      auVar77._4_4_ = auVar77._8_4_;
                      auVar77._0_4_ = auVar77._8_4_;
                      auVar77._12_4_ = auVar77._8_4_;
                      *local_1158 = ~auVar93 & auVar90 | auVar118 & auVar93;
                      local_1158[1] = ~auVar77 & auVar80 | auVar113 & auVar77;
                      local_1158[2] = auVar80 & auVar77 | ~auVar77 & auVar113;
                      local_1158 = local_1158 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar42 = 6;
            }
          } while (iVar42 == 0);
        } while (iVar42 != 6);
        local_1150 = (ulong)((uint)uVar58 & 0xf) - 8;
        if (local_1150 != 0) {
          uVar58 = uVar58 & 0xfffffffffffffff0;
          local_11b8 = context->scene;
          local_1148 = 0;
          do {
            lVar47 = local_1148 * 0x50;
            pGVar27 = (local_11b8->geometries).items[*(uint *)(uVar58 + 0x30 + lVar47)].ptr;
            fVar73 = pGVar27->fnumTimeSegments;
            fVar64 = (pGVar27->time_range).lower;
            fVar63 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar64) /
                     ((pGVar27->time_range).upper - fVar64)) * fVar73;
            fVar64 = floorf(fVar63);
            lVar32 = local_1148;
            fVar73 = fVar73 + -1.0;
            if (fVar73 <= fVar64) {
              fVar64 = fVar73;
            }
            fVar73 = 0.0;
            if (0.0 <= fVar64) {
              fVar73 = fVar64;
            }
            uVar54 = (ulong)*(uint *)(uVar58 + 4 + lVar47);
            lVar28 = *(long *)(*(long *)&pGVar27[2].numPrimitives + (long)(int)fVar73 * 0x38);
            lVar29 = *(long *)(*(long *)&pGVar27[2].numPrimitives + 0x38 + (long)(int)fVar73 * 0x38)
            ;
            pfVar21 = (float *)(lVar28 + (ulong)*(uint *)(uVar58 + lVar47) * 4);
            uVar55 = (ulong)*(uint *)(uVar58 + 0x10 + lVar47);
            pfVar22 = (float *)(lVar28 + uVar55 * 4);
            local_1140 = (ulong)*(uint *)(uVar58 + 0x20 + lVar47);
            puVar1 = (undefined8 *)(lVar28 + local_1140 * 4);
            uVar39 = *puVar1;
            uVar40 = puVar1[1];
            pfVar23 = (float *)(lVar28 + uVar54 * 4);
            uVar51 = (ulong)*(uint *)(uVar58 + 0x14 + lVar47);
            pfVar24 = (float *)(lVar28 + uVar51 * 4);
            uVar46 = (ulong)*(uint *)(uVar58 + 0x24 + lVar47);
            pfVar2 = (float *)(lVar28 + uVar46 * 4);
            uVar57 = (ulong)*(uint *)(uVar58 + 8 + lVar47);
            pfVar3 = (float *)(lVar28 + uVar57 * 4);
            uVar52 = (ulong)*(uint *)(uVar58 + 0x18 + lVar47);
            pfVar4 = (float *)(lVar28 + uVar52 * 4);
            uVar49 = (ulong)*(uint *)(uVar58 + 0x28 + lVar47);
            pfVar5 = (float *)(lVar28 + uVar49 * 4);
            uVar44 = (ulong)*(uint *)(uVar58 + 0xc + lVar47);
            pfVar6 = (float *)(lVar28 + uVar44 * 4);
            uVar43 = (ulong)*(uint *)(uVar58 + 0x1c + lVar47);
            pfVar7 = (float *)(lVar28 + uVar43 * 4);
            uVar53 = (ulong)*(uint *)(uVar58 + 0x2c + lVar47);
            pfVar8 = (float *)(lVar28 + uVar53 * 4);
            pfVar9 = (float *)(lVar29 + (ulong)*(uint *)(uVar58 + lVar47) * 4);
            pfVar10 = (float *)(lVar29 + uVar55 * 4);
            fVar63 = fVar63 - fVar73;
            pfVar11 = (float *)(lVar29 + uVar54 * 4);
            pfVar12 = (float *)(lVar29 + uVar57 * 4);
            local_f98 = pfVar22[2];
            fStack_f94 = pfVar24[2];
            fStack_f90 = pfVar4[2];
            fStack_f8c = pfVar7[2];
            local_fb8 = CONCAT44(*pfVar24,*pfVar22);
            _local_fa8 = CONCAT44(*pfVar7,*pfVar4);
            local_11f8 = (float)uVar39;
            fStack_11f4 = (float)((ulong)uVar39 >> 0x20);
            fStack_11f0 = (float)uVar40;
            pfVar13 = (float *)(lVar29 + uVar44 * 4);
            pfVar14 = (float *)(lVar29 + uVar52 * 4);
            pfVar15 = (float *)(lVar29 + uVar51 * 4);
            pfVar16 = (float *)(lVar29 + uVar43 * 4);
            pfVar17 = (float *)(lVar29 + local_1140 * 4);
            pfVar18 = (float *)(lVar29 + uVar49 * 4);
            pfVar19 = (float *)(lVar29 + uVar46 * 4);
            pfVar20 = (float *)(lVar29 + uVar53 * 4);
            fVar73 = 1.0 - fVar63;
            fVar110 = *pfVar21 * fVar73 + *pfVar9 * fVar63;
            fVar114 = *pfVar23 * fVar73 + *pfVar11 * fVar63;
            fVar115 = *pfVar3 * fVar73 + *pfVar12 * fVar63;
            fVar116 = *pfVar6 * fVar73 + *pfVar13 * fVar63;
            fVar133 = pfVar21[1] * fVar73 + pfVar9[1] * fVar63;
            fVar135 = pfVar23[1] * fVar73 + pfVar11[1] * fVar63;
            fVar137 = pfVar3[1] * fVar73 + pfVar12[1] * fVar63;
            fVar139 = pfVar6[1] * fVar73 + pfVar13[1] * fVar63;
            fVar78 = *pfVar4 * fVar73 + pfVar9[2] * fVar63;
            fVar85 = *pfVar7 * fVar73 + pfVar11[2] * fVar63;
            fVar86 = fStack_fa0 * fVar73 + pfVar12[2] * fVar63;
            fVar87 = fStack_f9c * fVar73 + pfVar13[2] * fVar63;
            fStack_11ec = (float)((ulong)uVar40 >> 0x20);
            puVar1 = (undefined8 *)(uVar58 + 0x30 + lVar47);
            local_f88 = *puVar1;
            uStack_f80 = puVar1[1];
            puVar1 = (undefined8 *)(uVar58 + 0x40 + lVar47);
            local_1108 = *puVar1;
            uStack_1100 = puVar1[1];
            fVar129 = fVar110 - (*pfVar22 * fVar73 + *pfVar10 * fVar63);
            fVar130 = fVar114 - (*pfVar24 * fVar73 + *pfVar15 * fVar63);
            fVar131 = fVar115 - (fStack_fb0 * fVar73 + *pfVar14 * fVar63);
            fVar132 = fVar116 - (fStack_fac * fVar73 + *pfVar16 * fVar63);
            fVar65 = fVar133 - (pfVar22[1] * fVar73 + pfVar10[1] * fVar63);
            fVar70 = fVar135 - (pfVar24[1] * fVar73 + pfVar15[1] * fVar63);
            fVar71 = fVar137 - (pfVar4[1] * fVar73 + pfVar14[1] * fVar63);
            fVar72 = fVar139 - (pfVar7[1] * fVar73 + pfVar16[1] * fVar63);
            fVar141 = fVar78 - (pfVar22[2] * fVar73 + pfVar10[2] * fVar63);
            fVar144 = fVar85 - (pfVar24[2] * fVar73 + pfVar15[2] * fVar63);
            fVar147 = fVar86 - (pfVar4[2] * fVar73 + pfVar14[2] * fVar63);
            fVar149 = fVar87 - (pfVar7[2] * fVar73 + pfVar16[2] * fVar63);
            fVar89 = (local_11f8 * fVar73 + *pfVar17 * fVar63) - fVar110;
            fVar96 = (*pfVar2 * fVar73 + *pfVar19 * fVar63) - fVar114;
            fVar97 = (*pfVar5 * fVar73 + *pfVar18 * fVar63) - fVar115;
            fVar98 = (*pfVar8 * fVar73 + *pfVar20 * fVar63) - fVar116;
            fVar99 = (fStack_11f4 * fVar73 + pfVar17[1] * fVar63) - fVar133;
            fVar107 = (pfVar2[1] * fVar73 + pfVar19[1] * fVar63) - fVar135;
            fVar108 = (pfVar5[1] * fVar73 + pfVar18[1] * fVar63) - fVar137;
            fVar109 = (pfVar8[1] * fVar73 + pfVar20[1] * fVar63) - fVar139;
            fVar120 = (fVar73 * fStack_11f0 + fVar63 * pfVar17[2]) - fVar78;
            fVar122 = (fVar73 * pfVar2[2] + fVar63 * pfVar19[2]) - fVar85;
            fVar123 = (fVar73 * fStack_11f0 + fVar63 * pfVar18[2]) - fVar86;
            fVar124 = (fVar73 * fStack_11ec + fVar63 * pfVar20[2]) - fVar87;
            auVar119._0_4_ = fVar141 * fVar99 - fVar65 * fVar120;
            auVar119._4_4_ = fVar144 * fVar107 - fVar70 * fVar122;
            auVar119._8_4_ = fVar147 * fVar108 - fVar71 * fVar123;
            auVar119._12_4_ = fVar149 * fVar109 - fVar72 * fVar124;
            fVar73 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar64 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar63 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar128 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar143 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar146 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar110 = fVar110 - fVar73;
            fVar114 = fVar114 - fVar73;
            fVar115 = fVar115 - fVar73;
            fVar116 = fVar116 - fVar73;
            fVar133 = fVar133 - fVar64;
            fVar135 = fVar135 - fVar64;
            fVar137 = fVar137 - fVar64;
            fVar139 = fVar139 - fVar64;
            fVar151 = fVar110 * fVar143 - fVar133 * fVar128;
            fVar152 = fVar114 * fVar143 - fVar135 * fVar128;
            fVar153 = fVar115 * fVar143 - fVar137 * fVar128;
            fVar154 = fVar116 * fVar143 - fVar139 * fVar128;
            auVar66._0_4_ = fVar129 * fVar120 - fVar141 * fVar89;
            auVar66._4_4_ = fVar130 * fVar122 - fVar144 * fVar96;
            auVar66._8_4_ = fVar131 * fVar123 - fVar147 * fVar97;
            auVar66._12_4_ = fVar132 * fVar124 - fVar149 * fVar98;
            fVar78 = fVar78 - fVar63;
            fVar85 = fVar85 - fVar63;
            fVar86 = fVar86 - fVar63;
            fVar87 = fVar87 - fVar63;
            fVar73 = fVar78 * fVar128 - fVar110 * fVar146;
            fVar64 = fVar85 * fVar128 - fVar114 * fVar146;
            fVar63 = fVar86 * fVar128 - fVar115 * fVar146;
            fVar88 = fVar87 * fVar128 - fVar116 * fVar146;
            fVar134 = fVar65 * fVar89 - fVar129 * fVar99;
            fVar136 = fVar70 * fVar96 - fVar130 * fVar107;
            fVar138 = fVar71 * fVar97 - fVar131 * fVar108;
            fVar140 = fVar72 * fVar98 - fVar132 * fVar109;
            fVar142 = fVar133 * fVar146 - fVar78 * fVar143;
            fVar145 = fVar135 * fVar146 - fVar85 * fVar143;
            fVar148 = fVar137 * fVar146 - fVar86 * fVar143;
            fVar150 = fVar139 * fVar146 - fVar87 * fVar143;
            fVar125 = fVar128 * auVar119._0_4_ + fVar143 * auVar66._0_4_ + fVar146 * fVar134;
            fVar126 = fVar128 * auVar119._4_4_ + fVar143 * auVar66._4_4_ + fVar146 * fVar136;
            fVar127 = fVar128 * auVar119._8_4_ + fVar143 * auVar66._8_4_ + fVar146 * fVar138;
            fVar128 = fVar128 * auVar119._12_4_ + fVar143 * auVar66._12_4_ + fVar146 * fVar140;
            uVar59 = (uint)fVar125 & 0x80000000;
            uVar60 = (uint)fVar126 & 0x80000000;
            uVar61 = (uint)fVar127 & 0x80000000;
            uVar62 = (uint)fVar128 & 0x80000000;
            auVar94._0_4_ =
                 (float)((uint)(fVar89 * fVar142 + fVar99 * fVar73 + fVar120 * fVar151) ^ uVar59);
            auVar94._4_4_ =
                 (float)((uint)(fVar96 * fVar145 + fVar107 * fVar64 + fVar122 * fVar152) ^ uVar60);
            auVar94._8_4_ =
                 (float)((uint)(fVar97 * fVar148 + fVar108 * fVar63 + fVar123 * fVar153) ^ uVar61);
            auVar94._12_4_ =
                 (float)((uint)(fVar98 * fVar150 + fVar109 * fVar88 + fVar124 * fVar154) ^ uVar62);
            fVar143 = (float)((uint)(fVar142 * fVar129 + fVar73 * fVar65 + fVar151 * fVar141) ^
                             uVar59);
            fVar146 = (float)((uint)(fVar145 * fVar130 + fVar64 * fVar70 + fVar152 * fVar144) ^
                             uVar60);
            fVar63 = (float)((uint)(fVar148 * fVar131 + fVar63 * fVar71 + fVar153 * fVar147) ^
                            uVar61);
            fVar65 = (float)((uint)(fVar150 * fVar132 + fVar88 * fVar72 + fVar154 * fVar149) ^
                            uVar62);
            fVar73 = ABS(fVar125);
            fVar64 = ABS(fVar126);
            auVar121._0_8_ = CONCAT44(fVar126,fVar125) & 0x7fffffff7fffffff;
            auVar121._8_4_ = ABS(fVar127);
            auVar121._12_4_ = ABS(fVar128);
            auVar83._0_4_ =
                 -(uint)(auVar94._0_4_ + fVar143 <= fVar73) &
                 -(uint)((0.0 <= fVar143 && 0.0 <= auVar94._0_4_) && fVar125 != 0.0) & local_fc8;
            auVar83._4_4_ =
                 -(uint)(auVar94._4_4_ + fVar146 <= fVar64) &
                 -(uint)((0.0 <= fVar146 && 0.0 <= auVar94._4_4_) && fVar126 != 0.0) & uStack_fc4;
            auVar83._8_4_ =
                 -(uint)(auVar94._8_4_ + fVar63 <= auVar121._8_4_) &
                 -(uint)((0.0 <= fVar63 && 0.0 <= auVar94._8_4_) && fVar127 != 0.0) & uStack_fc0;
            auVar83._12_4_ =
                 -(uint)(auVar94._12_4_ + fVar65 <= auVar121._12_4_) &
                 -(uint)((0.0 <= fVar65 && 0.0 <= auVar94._12_4_) && fVar128 != 0.0) & uStack_fbc;
            iVar42 = movmskps((int)lVar29,auVar83);
            if (iVar42 != 0) {
              auVar106._0_4_ =
                   (float)(uVar59 ^ (uint)(fVar110 * auVar119._0_4_ +
                                          fVar133 * auVar66._0_4_ + fVar78 * fVar134));
              auVar106._4_4_ =
                   (float)(uVar60 ^ (uint)(fVar114 * auVar119._4_4_ +
                                          fVar135 * auVar66._4_4_ + fVar85 * fVar136));
              auVar106._8_4_ =
                   (float)(uVar61 ^ (uint)(fVar115 * auVar119._8_4_ +
                                          fVar137 * auVar66._8_4_ + fVar86 * fVar138));
              auVar106._12_4_ =
                   (float)(uVar62 ^ (uint)(fVar116 * auVar119._12_4_ +
                                          fVar139 * auVar66._12_4_ + fVar87 * fVar140));
              fVar128 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar70 = (ray->super_RayK<1>).tfar;
              uVar59 = -(uint)(auVar106._0_4_ <= fVar70 * fVar73 &&
                              fVar128 * fVar73 < auVar106._0_4_) & auVar83._0_4_;
              uVar60 = -(uint)(auVar106._4_4_ <= fVar70 * fVar64 &&
                              fVar128 * fVar64 < auVar106._4_4_) & auVar83._4_4_;
              uVar61 = -(uint)(auVar106._8_4_ <= fVar70 * auVar121._8_4_ &&
                              fVar128 * auVar121._8_4_ < auVar106._8_4_) & auVar83._8_4_;
              uVar62 = -(uint)(auVar106._12_4_ <= fVar70 * auVar121._12_4_ &&
                              fVar128 * auVar121._12_4_ < auVar106._12_4_) & auVar83._12_4_;
              auVar37._4_4_ = uVar60;
              auVar37._0_4_ = uVar59;
              auVar37._8_4_ = uVar61;
              auVar37._12_4_ = uVar62;
              iVar42 = movmskps(iVar42,auVar37);
              if (iVar42 != 0) {
                local_10f8 = auVar94;
                local_10e8 = fVar143;
                fStack_10e4 = fVar146;
                fStack_10e0 = fVar63;
                fStack_10dc = fVar65;
                local_10d8 = auVar106;
                local_10c8 = auVar121;
                local_10a8 = uVar59;
                uStack_10a4 = uVar60;
                uStack_10a0 = uVar61;
                uStack_109c = uVar62;
                local_1068 = auVar119;
                local_1058 = auVar66;
                local_1048[0] = fVar134;
                local_1048[1] = fVar136;
                local_1048[2] = fVar138;
                local_1048[3] = fVar140;
                auVar79 = rcpps(auVar66,auVar121);
                fVar128 = auVar79._0_4_;
                fVar70 = auVar79._4_4_;
                fVar71 = auVar79._8_4_;
                fVar72 = auVar79._12_4_;
                fVar128 = (1.0 - fVar73 * fVar128) * fVar128 + fVar128;
                fVar70 = (1.0 - fVar64 * fVar70) * fVar70 + fVar70;
                fVar71 = (1.0 - auVar121._8_4_ * fVar71) * fVar71 + fVar71;
                fVar72 = (1.0 - auVar121._12_4_ * fVar72) * fVar72 + fVar72;
                fVar73 = auVar106._0_4_ * fVar128;
                fVar64 = auVar106._4_4_ * fVar70;
                fVar78 = auVar106._8_4_ * fVar71;
                fVar85 = auVar106._12_4_ * fVar72;
                local_1078[0] = fVar73;
                local_1078[1] = fVar64;
                local_1078[2] = fVar78;
                local_1078[3] = fVar85;
                local_1098[0] = auVar94._0_4_ * fVar128;
                local_1098[1] = auVar94._4_4_ * fVar70;
                local_1098[2] = auVar94._8_4_ * fVar71;
                local_1098[3] = auVar94._12_4_ * fVar72;
                local_11c8._4_4_ = uVar60;
                local_11c8._0_4_ = uVar59;
                local_11c8._8_4_ = uVar61;
                local_11c8._12_4_ = uVar62;
                local_1088[0] = fVar128 * fVar143;
                local_1088[1] = fVar70 * fVar146;
                local_1088[2] = fVar71 * fVar63;
                local_1088[3] = fVar72 * fVar65;
                auVar67._0_4_ = uVar59 & (uint)fVar73;
                auVar67._4_4_ = uVar60 & (uint)fVar64;
                auVar67._8_4_ = uVar61 & (uint)fVar78;
                auVar67._12_4_ = uVar62 & (uint)fVar85;
                auVar84._0_8_ = CONCAT44(~uVar60,~uVar59) & 0x7f8000007f800000;
                auVar84._8_4_ = ~uVar61 & 0x7f800000;
                auVar84._12_4_ = ~uVar62 & 0x7f800000;
                auVar84 = auVar84 | auVar67;
                auVar95._4_4_ = auVar84._0_4_;
                auVar95._0_4_ = auVar84._4_4_;
                auVar95._8_4_ = auVar84._12_4_;
                auVar95._12_4_ = auVar84._8_4_;
                auVar79 = minps(auVar95,auVar84);
                auVar68._0_8_ = auVar79._8_8_;
                auVar68._8_4_ = auVar79._0_4_;
                auVar68._12_4_ = auVar79._4_4_;
                auVar79 = minps(auVar68,auVar79);
                auVar69._0_4_ = -(uint)(auVar79._0_4_ == auVar84._0_4_) & uVar59;
                auVar69._4_4_ = -(uint)(auVar79._4_4_ == auVar84._4_4_) & uVar60;
                auVar69._8_4_ = -(uint)(auVar79._8_4_ == auVar84._8_4_) & uVar61;
                auVar69._12_4_ = -(uint)(auVar79._12_4_ == auVar84._12_4_) & uVar62;
                iVar42 = movmskps(iVar42,auVar69);
                if (iVar42 != 0) {
                  uVar59 = auVar69._0_4_;
                  uVar60 = auVar69._4_4_;
                  uVar61 = auVar69._8_4_;
                  uVar62 = auVar69._12_4_;
                }
                auVar38._4_4_ = uVar60;
                auVar38._0_4_ = uVar59;
                auVar38._8_4_ = uVar61;
                auVar38._12_4_ = uVar62;
                uVar50 = movmskps(iVar42,auVar38);
                uVar44 = CONCAT44((int)((ulong)lVar29 >> 0x20),uVar50);
                piVar48 = (int *)0x0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> (long)piVar48 & 1) == 0; piVar48 = (int *)((long)piVar48 + 1)) {
                  }
                }
                do {
                  uVar59 = *(uint *)((long)&local_f88 + (long)piVar48 * 4);
                  pGVar27 = (local_11b8->geometries).items[uVar59].ptr;
                  if ((pGVar27->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_11c8 + (long)piVar48 * 4) = 0;
                  }
                  else {
                    pRVar30 = context->args;
                    if ((pRVar30->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar73 = local_1098[(long)piVar48];
                      fVar64 = local_1088[(long)piVar48];
                      (ray->super_RayK<1>).tfar = local_1078[(long)piVar48];
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1068 + (long)piVar48 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_1058 + (long)piVar48 * 4);
                      (ray->Ng).field_0.field_0.z = local_1048[(long)piVar48];
                      ray->u = fVar73;
                      ray->v = fVar64;
                      ray->primID = *(uint *)((long)&local_1108 + (long)piVar48 * 4);
                      ray->geomID = uVar59;
                      pRVar31 = context->user;
                      ray->instID[0] = pRVar31->instID[0];
                      ray->instPrimID[0] = pRVar31->instPrimID[0];
                      break;
                    }
                    local_11b0.context = context->user;
                    local_1138 = *(float *)(local_1068 + (long)piVar48 * 4);
                    local_1134 = *(undefined4 *)(local_1058 + (long)piVar48 * 4);
                    local_1130 = local_1048[(long)piVar48];
                    local_112c = local_1098[(long)piVar48];
                    local_1128 = local_1088[(long)piVar48];
                    local_1124 = *(undefined4 *)((long)&local_1108 + (long)piVar48 * 4);
                    local_1120 = uVar59;
                    local_111c = (local_11b0.context)->instID[0];
                    local_1118 = (local_11b0.context)->instPrimID[0];
                    fVar63 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = local_1078[(long)piVar48];
                    local_11cc = -1;
                    local_11b0.valid = &local_11cc;
                    local_11b0.geometryUserPtr = pGVar27->userPtr;
                    local_11b0.ray = (RTCRayN *)ray;
                    local_11b0.hit = (RTCHitN *)&local_1138;
                    local_11b0.N = 1;
                    if ((pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar27->intersectionFilterN)(&local_11b0), *local_11b0.valid != 0)) {
                      if (pRVar30->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar30->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar27->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar30->filter)(&local_11b0);
                        }
                        if (*local_11b0.valid == 0) goto LAB_00dee60f;
                      }
                      (((Vec3f *)((long)local_11b0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11b0.hit;
                      (((Vec3f *)((long)local_11b0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11b0.hit + 4);
                      (((Vec3f *)((long)local_11b0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11b0.hit + 8);
                      *(float *)((long)local_11b0.ray + 0x3c) = *(float *)(local_11b0.hit + 0xc);
                      *(float *)((long)local_11b0.ray + 0x40) = *(float *)(local_11b0.hit + 0x10);
                      *(float *)((long)local_11b0.ray + 0x44) = *(float *)(local_11b0.hit + 0x14);
                      *(float *)((long)local_11b0.ray + 0x48) = *(float *)(local_11b0.hit + 0x18);
                      *(float *)((long)local_11b0.ray + 0x4c) = *(float *)(local_11b0.hit + 0x1c);
                      *(float *)((long)local_11b0.ray + 0x50) = *(float *)(local_11b0.hit + 0x20);
                      pRVar45 = (RayHit *)local_11b0.ray;
                    }
                    else {
LAB_00dee60f:
                      (ray->super_RayK<1>).tfar = fVar63;
                      pRVar45 = ray;
                    }
                    uVar59 = (uint)pRVar45;
                    *(undefined4 *)(local_11c8 + (long)piVar48 * 4) = 0;
                    fVar63 = (ray->super_RayK<1>).tfar;
                    local_11c8._0_4_ = -(uint)(fVar73 <= fVar63) & local_11c8._0_4_;
                    local_11c8._4_4_ = -(uint)(fVar64 <= fVar63) & local_11c8._4_4_;
                    local_11c8._8_4_ = -(uint)(fVar78 <= fVar63) & local_11c8._8_4_;
                    local_11c8._12_4_ = -(uint)(fVar85 <= fVar63) & local_11c8._12_4_;
                  }
                  iVar42 = movmskps(uVar59,local_11c8);
                  if (iVar42 == 0) break;
                  BVHNIntersector1<4,16777232,false,embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Moeller<4,true>>>
                  ::intersect();
                  piVar48 = local_11b0.valid;
                } while( true );
              }
            }
            local_1148 = lVar32 + 1;
          } while (local_1148 != local_1150);
        }
        fVar73 = (ray->super_RayK<1>).tfar;
        auVar79._4_4_ = fVar73;
        auVar79._0_4_ = fVar73;
        auVar79._8_4_ = fVar73;
        auVar79._12_4_ = fVar73;
        uVar44 = local_1168;
        uVar46 = local_1180;
        uVar49 = local_1160;
        uVar51 = local_1178;
        uVar53 = local_1170;
        fVar73 = local_fd8;
        fVar64 = fStack_fd4;
        fVar63 = fStack_fd0;
        fVar128 = fStack_fcc;
        fVar143 = local_fe8;
        fVar146 = fStack_fe4;
        fVar65 = fStack_fe0;
        fVar70 = fStack_fdc;
        fVar71 = local_ff8;
        fVar72 = fStack_ff4;
        fVar78 = fStack_ff0;
        fVar85 = fStack_fec;
        fVar86 = local_1008;
        fVar87 = fStack_1004;
        fVar88 = fStack_1000;
        fVar89 = fStack_ffc;
        fVar96 = local_1018;
        fVar97 = fStack_1014;
        fVar98 = fStack_1010;
        fVar99 = fStack_100c;
        fVar107 = local_1028;
        fVar108 = fStack_1024;
        fVar109 = fStack_1020;
        fVar110 = fStack_101c;
        fVar114 = local_1038;
        fVar115 = fStack_1034;
        fVar116 = fStack_1030;
        fVar120 = fStack_102c;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }